

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O3

void __thiscall
wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
          (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *this,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          DefaultTypeNameGenerator *fallback,string *prefix)

{
  IString *this_00;
  bool bVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  __hashtable *p_Var5;
  ulong __val;
  char cVar6;
  pointer pHVar7;
  string_view s;
  uintptr_t local_130;
  size_t local_128;
  char *local_120;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_118;
  string_view local_e0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_98;
  string *local_90;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_88;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *local_80;
  size_type *local_78;
  string __str;
  __hashtable *__h;
  __buckets_ptr local_40;
  size_type sStack_38;
  
  (this->defaultGenerator).structCount = 0;
  (this->defaultGenerator).arrayCount = 0;
  (this->defaultGenerator).funcCount = 0;
  (this->defaultGenerator).contCount = 0;
  (this->defaultGenerator).nameCache._M_h._M_buckets =
       &(this->defaultGenerator).nameCache._M_h._M_single_bucket;
  (this->defaultGenerator).nameCache._M_h._M_bucket_count = 1;
  (this->defaultGenerator).nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->defaultGenerator).nameCache._M_h._M_element_count = 0;
  (this->defaultGenerator).nameCache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->defaultGenerator).nameCache._M_h._M_rehash_policy._M_next_resize = 0;
  (this->defaultGenerator).nameCache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->fallback = fallback;
  (this->names)._M_h._M_buckets = &(this->names)._M_h._M_single_bucket;
  (this->names)._M_h._M_bucket_count = 1;
  (this->names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->names)._M_h._M_element_count = 0;
  (this->names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pHVar7 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar7) {
    local_80 = &(this->defaultGenerator).nameCache;
    __str.field_2._8_8_ = &this->names;
    __val = 0;
    local_90 = prefix;
    local_88 = types;
    do {
      cVar6 = '\x01';
      if (9 < __val) {
        uVar4 = __val;
        cVar2 = '\x04';
        do {
          cVar6 = cVar2;
          if (uVar4 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_00cb5467;
          }
          if (uVar4 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_00cb5467;
          }
          if (uVar4 < 10000) goto LAB_00cb5467;
          bVar1 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar2 = cVar6 + '\x04';
        } while (bVar1);
        cVar6 = cVar6 + '\x01';
      }
LAB_00cb5467:
      local_78 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78,(uint)__str._M_dataplus._M_p,__val);
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_78,0,(char *)0x0,(ulong)(local_90->_M_dataplus)._M_p
                                 );
      __h = (__hashtable *)&local_40;
      p_Var5 = (__hashtable *)(plVar3 + 2);
      if ((__hashtable *)*plVar3 == p_Var5) {
        local_40 = p_Var5->_M_buckets;
        sStack_38 = plVar3[3];
      }
      else {
        local_40 = p_Var5->_M_buckets;
        __h = (__hashtable *)*plVar3;
      }
      this_00 = (IString *)plVar3[1];
      *plVar3 = (long)p_Var5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      s._M_str = (char *)0x0;
      s._M_len = (size_t)__h;
      local_e0 = IString::interned(this_00,s,SUB81(p_Var5,0));
      local_d0._M_buckets = &local_d0._M_single_bucket;
      local_d0._M_bucket_count = 1;
      local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d0._M_element_count = 0;
      local_d0._M_rehash_policy._M_max_load_factor = 1.0;
      local_d0._M_rehash_policy._4_4_ = 0;
      local_d0._M_rehash_policy._M_next_resize = 0;
      local_d0._M_single_bucket = (__node_base_ptr)0x0;
      local_130 = pHVar7[__val].id;
      local_128 = local_e0._M_len;
      local_120 = local_e0._M_str;
      local_118._M_buckets = (__buckets_ptr)0x0;
      local_118._M_bucket_count = 1;
      local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_118._M_element_count = 0;
      local_118._M_rehash_policy._M_max_load_factor = 1.0;
      local_118._M_rehash_policy._4_4_ = 0;
      local_118._M_rehash_policy._M_next_resize = 0;
      local_118._M_single_bucket = (__node_base_ptr)0x0;
      local_98._M_h = (__hashtable_alloc *)&local_118;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_98._M_h,&local_d0,&local_98);
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)__str.field_2._8_8_,&local_130);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_118);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_d0);
      if (__h != (__hashtable *)&local_40) {
        operator_delete(__h,(long)local_40 + 1);
      }
      if (local_78 != &__str._M_string_length) {
        operator_delete(local_78,__str._M_string_length + 1);
      }
      __val = __val + 1;
      pHVar7 = (local_88->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (__val < (ulong)((long)(local_88->
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7 >> 3))
    ;
  }
  return;
}

Assistant:

IndexedTypeNameGenerator(T& types,
                           FallbackGenerator& fallback,
                           const std::string& prefix = "")
    : fallback(fallback) {
    for (size_t i = 0; i < types.size(); ++i) {
      names.insert({types[i], {prefix + std::to_string(i), {}}});
    }
  }